

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

void jpeg_save_markers(j_decompress_ptr cinfo,int marker_code,uint length_limit)

{
  long lVar1;
  long lVar2;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  jpeg_marker_parser_method processor;
  long maxlength;
  my_marker_ptr_conflict marker;
  code *local_28;
  uint local_10;
  
  lVar1 = in_RDI[0x49];
  lVar2 = *(long *)(in_RDI[1] + 0x60) + -0x20;
  local_10 = in_EDX;
  if (lVar2 < (long)(ulong)in_EDX) {
    local_10 = (uint)lVar2;
  }
  if (local_10 == 0) {
    local_28 = skip_variable;
    if ((in_ESI == 0xe0) || (in_ESI == 0xee)) {
      local_28 = get_interesting_appn;
    }
  }
  else {
    local_28 = save_marker;
    if ((in_ESI == 0xe0) && (local_10 < 0xe)) {
      local_10 = 0xe;
    }
    else if ((in_ESI == 0xee) && (local_10 < 0xc)) {
      local_10 = 0xc;
    }
  }
  if (in_ESI == 0xfe) {
    *(code **)(lVar1 + 0x28) = local_28;
    *(uint *)(lVar1 + 0xb0) = local_10;
  }
  else if ((in_ESI < 0xe0) || (0xef < in_ESI)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x44;
    *(int *)(*in_RDI + 0x2c) = in_ESI;
    (**(code **)*in_RDI)(in_RDI);
  }
  else {
    *(code **)(lVar1 + 0x30 + (long)(in_ESI + -0xe0) * 8) = local_28;
    *(uint *)(lVar1 + 0xb4 + (long)(in_ESI + -0xe0) * 4) = local_10;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_save_markers(j_decompress_ptr cinfo, int marker_code,
                  unsigned int length_limit)
{
  my_marker_ptr marker = (my_marker_ptr)cinfo->marker;
  long maxlength;
  jpeg_marker_parser_method processor;

  /* Length limit mustn't be larger than what we can allocate
   * (should only be a concern in a 16-bit environment).
   */
  maxlength = cinfo->mem->max_alloc_chunk - sizeof(struct jpeg_marker_struct);
  if (((long)length_limit) > maxlength)
    length_limit = (unsigned int)maxlength;

  /* Choose processor routine to use.
   * APP0/APP14 have special requirements.
   */
  if (length_limit) {
    processor = save_marker;
    /* If saving APP0/APP14, save at least enough for our internal use. */
    if (marker_code == (int)M_APP0 && length_limit < APP0_DATA_LEN)
      length_limit = APP0_DATA_LEN;
    else if (marker_code == (int)M_APP14 && length_limit < APP14_DATA_LEN)
      length_limit = APP14_DATA_LEN;
  } else {
    processor = skip_variable;
    /* If discarding APP0/APP14, use our regular on-the-fly processor. */
    if (marker_code == (int)M_APP0 || marker_code == (int)M_APP14)
      processor = get_interesting_appn;
  }

  if (marker_code == (int)M_COM) {
    marker->process_COM = processor;
    marker->length_limit_COM = length_limit;
  } else if (marker_code >= (int)M_APP0 && marker_code <= (int)M_APP15) {
    marker->process_APPn[marker_code - (int)M_APP0] = processor;
    marker->length_limit_APPn[marker_code - (int)M_APP0] = length_limit;
  } else
    ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, marker_code);
}